

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O1

bool multicastMembershipHelper
               (QNativeSocketEnginePrivate *d,int how6,int how4,QHostAddress *groupAddress,
               QNetworkInterface *interface)

{
  NetworkLayerProtocol NVar1;
  int iVar2;
  quint32 qVar3;
  char *pcVar4;
  int *piVar5;
  ErrorString errorString;
  SocketError error;
  undefined4 in_register_00000034;
  socklen_t __optlen;
  long lVar6;
  undefined8 *__optval;
  QNetworkAddressEntry *entry;
  long in_FS_OFFSET;
  bool bVar7;
  QHostAddress ip;
  ip_mreq mreq4;
  QNetworkAddressEntry local_80;
  QArrayDataPointer<QNetworkAddressEntry> local_78;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined4 local_48;
  long local_38;
  
  pcVar4 = (char *)CONCAT44(in_register_00000034,how6);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  NVar1 = QHostAddress::protocol(groupAddress);
  if (NVar1 == IPv6Protocol) {
    __optval = (undefined8 *)local_58;
    local_58 = ZEXT816(0);
    local_48 = 0;
    local_58 = (undefined1  [16])QHostAddress::toIPv6Address(groupAddress);
    pcVar4 = QNetworkInterface::index((QNetworkInterface *)interface,pcVar4,local_58._8_4_);
    local_48 = SUB84(pcVar4,0);
    iVar2 = 0x29;
    __optlen = 0x14;
LAB_00233282:
    iVar2 = setsockopt((int)d->socketDescriptor,iVar2,how6,__optval,__optlen);
    bVar7 = iVar2 != -1;
    if (bVar7) goto LAB_002332e6;
    piVar5 = __errno_location();
    if (*piVar5 == 99) {
      error = SocketAddressNotAvailableError;
      errorString = AddressNotAvailableErrorString;
    }
    else if (*piVar5 == 0x5c) {
      error = UnsupportedSocketOperationError;
      errorString = OperationUnsupportedErrorString;
    }
    else {
      error = UnknownSocketError;
      errorString = UnknownSocketErrorString;
    }
LAB_002332df:
    QNativeSocketEnginePrivate::setError(d,error,errorString);
  }
  else {
    NVar1 = QHostAddress::protocol(groupAddress);
    if (NVar1 != IPv4Protocol) {
      error = UnsupportedSocketOperationError;
      errorString = ProtocolUnsupportedErrorString;
      goto LAB_002332df;
    }
    local_60 = (undefined1 *)0x0;
    qVar3 = QHostAddress::toIPv4Address(groupAddress,(bool *)0x0);
    local_60 = (undefined1 *)
               CONCAT44(local_60._4_4_,
                        qVar3 >> 0x18 | (qVar3 & 0xff0000) >> 8 | (qVar3 & 0xff00) << 8 |
                        qVar3 << 0x18);
    bVar7 = QNetworkInterface::isValid((QNetworkInterface *)interface);
    if (!bVar7) {
      local_60 = (undefined1 *)((ulong)local_60 & 0xffffffff);
LAB_002333f7:
      iVar2 = 0;
      __optval = &local_60;
      __optlen = 8;
      how6 = how4;
      goto LAB_00233282;
    }
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QNetworkAddressEntry *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkInterface::addressEntries
              ((QList<QNetworkAddressEntry> *)&local_78,(QNetworkInterface *)interface);
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      lVar6 = local_78.size * 8;
      bVar7 = false;
      do {
        lVar6 = lVar6 + -8;
        local_80.d._M_t.
        super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
        ._M_t.
        super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
        .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl =
             (unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
              )&DAT_aaaaaaaaaaaaaaaa;
        QNetworkAddressEntry::ip(&local_80);
        NVar1 = QHostAddress::protocol((QHostAddress *)&local_80);
        if (NVar1 == IPv4Protocol) {
          qVar3 = QHostAddress::toIPv4Address((QHostAddress *)&local_80,(bool *)0x0);
          local_60 = (undefined1 *)
                     CONCAT44(qVar3 >> 0x18 | (qVar3 & 0xff0000) >> 8 | (qVar3 & 0xff00) << 8 |
                              qVar3 << 0x18,(undefined4)local_60);
          bVar7 = true;
        }
        QHostAddress::~QHostAddress((QHostAddress *)&local_80);
      } while ((NVar1 != IPv4Protocol) && (lVar6 != 0));
      if (bVar7) {
        QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_78);
        goto LAB_002333f7;
      }
    }
    QNativeSocketEnginePrivate::setError(d,NetworkError,NetworkUnreachableErrorString);
    QArrayDataPointer<QNetworkAddressEntry>::~QArrayDataPointer(&local_78);
  }
  bVar7 = false;
LAB_002332e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

static bool multicastMembershipHelper(QNativeSocketEnginePrivate *d,
                                      int how6,
                                      int how4,
                                      const QHostAddress &groupAddress,
                                      const QNetworkInterface &interface)
{
    int level = 0;
    int sockOpt = 0;
    void *sockArg;
    int sockArgSize;

    ip_mreq mreq4;
    ipv6_mreq mreq6;

    if (groupAddress.protocol() == QAbstractSocket::IPv6Protocol) {
        level = IPPROTO_IPV6;
        sockOpt = how6;
        sockArg = &mreq6;
        sockArgSize = sizeof(mreq6);
        memset(&mreq6, 0, sizeof(mreq6));
        Q_IPV6ADDR ip6 = groupAddress.toIPv6Address();
        memcpy(&mreq6.ipv6mr_multiaddr, &ip6, sizeof(ip6));
        mreq6.ipv6mr_interface = interface.index();
    } else if (groupAddress.protocol() == QAbstractSocket::IPv4Protocol) {
        level = IPPROTO_IP;
        sockOpt = how4;
        sockArg = &mreq4;
        sockArgSize = sizeof(mreq4);
        memset(&mreq4, 0, sizeof(mreq4));
        mreq4.imr_multiaddr.s_addr = htonl(groupAddress.toIPv4Address());

        if (interface.isValid()) {
            const QList<QNetworkAddressEntry> addressEntries = interface.addressEntries();
            bool found = false;
            for (const QNetworkAddressEntry &entry : addressEntries) {
                const QHostAddress ip = entry.ip();
                if (ip.protocol() == QAbstractSocket::IPv4Protocol) {
                    mreq4.imr_interface.s_addr = htonl(ip.toIPv4Address());
                    found = true;
                    break;
                }
            }
            if (!found) {
                d->setError(QAbstractSocket::NetworkError,
                            QNativeSocketEnginePrivate::NetworkUnreachableErrorString);
                return false;
            }
        } else {
            mreq4.imr_interface.s_addr = INADDR_ANY;
        }
    } else {
        // unreachable
        d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                    QNativeSocketEnginePrivate::ProtocolUnsupportedErrorString);
        return false;
    }

    int res = setsockopt(d->socketDescriptor, level, sockOpt, sockArg, sockArgSize);
    if (res == -1) {
        switch (errno) {
        case ENOPROTOOPT:
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                        QNativeSocketEnginePrivate::OperationUnsupportedErrorString);
            break;
        case EADDRNOTAVAIL:
            d->setError(QAbstractSocket::SocketAddressNotAvailableError,
                        QNativeSocketEnginePrivate::AddressNotAvailableErrorString);
            break;
        default:
            d->setError(QAbstractSocket::UnknownSocketError,
                        QNativeSocketEnginePrivate::UnknownSocketErrorString);
            break;
        }
        return false;
    }
    return true;
}